

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O3

FailCodeType __thiscall
mittens::
GenericExceptionHandler<MyException2,_mittens::GenericExceptionHandler<MyException1,_mittens::UnHandler<foo_Result>,_mittens::DefaultNoAction<MyException1>_>,_mittens::DefaultNoAction<MyException2>_>
::handleException(GenericExceptionHandler<MyException2,_mittens::GenericExceptionHandler<MyException1,_mittens::UnHandler<foo_Result>,_mittens::DefaultNoAction<MyException1>_>,_mittens::DefaultNoAction<MyException2>_>
                  *this)

{
  FailCodeType FVar1;
  
  FVar1 = GenericExceptionHandler<MyException1,_mittens::UnHandler<foo_Result>,_mittens::DefaultNoAction<MyException1>_>
          ::handleException(&this->nestedHandler);
  return FVar1;
}

Assistant:

FailCodeType handleException() 
      {
         // Handle the general non-catch-all case 
         static_assert(!std::is_same<void, ExceptionType>::value, "Something wrong: specialization failed. ExceptionType is 'void'");
         try
         {
            return nestedHandler();
         }
         catch (ExceptionType& e)
         {
            try
            {
               // Run custom action, passing it 'e'
               // If the return type of the custom action is the same as FailCodeType (as opposed to void or even less plausible something else)
               // then return the result of custom action as the fail code.
               using ReturnActionResult = typename std::is_same< FailCodeType, decltype(customAction_(e))>::type;
               return runAction(e, ReturnActionResult{});
            }
            catch (...)
            {
               // Force the action no-throw by suppressing any exceptions unless requested not to.
               if (!supressExceptionsInAction_)
                  throw;
            }
            return failCode_;
         }
      }